

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O1

void __thiscall common::Options::Init(Options *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  Log *this_00;
  string *psVar3;
  char *pcVar4;
  string local_50;
  
  do {
    while( true ) {
      iVar2 = getopt(argc,argv,"l:f:c:");
      pcVar1 = _optarg;
      if (iVar2 < 0x66) break;
      if (iVar2 == 0x66) {
        pcVar4 = (char *)(this->log_file)._M_string_length;
        strlen(_optarg);
        psVar3 = &this->log_file;
LAB_0010ff95:
        std::__cxx11::string::_M_replace((ulong)psVar3,0,pcVar4,(ulong)pcVar1);
      }
      else if (iVar2 == 0x6c) {
        iVar2 = xlib::Atoi(_optarg);
        this->log_level = iVar2;
      }
    }
    if (iVar2 == 99) {
      pcVar4 = (char *)(this->config_file)._M_string_length;
      strlen(_optarg);
      psVar3 = &this->config_file;
      goto LAB_0010ff95;
    }
    if (iVar2 == -1) {
      this_00 = xlib::Log::Instance();
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"optind %v","");
      xlib::Log::SWrite<int>
                (this_00,LOG_PRIORITY_DEBUG,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/u35s[P]xtools/src/common/options.cc"
                 ,0x3a,"Init",true,&local_50,(int *)&optind);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      this->opt_cur = _optind;
      return;
    }
  } while( true );
}

Assistant:

void Options::Init(int argc, char **argv) {
    int opt  = 0;
    while ( -1 != (opt = getopt(argc, argv, "l:f:c:")) ) {
        switch (opt) {
            case 'l':
                log_level = xlib::Atoi(optarg);
                break;
            case 'f':
                log_file = optarg;
                break;
            case 'c':
                config_file = optarg;
                break;
        }
    }
    XDBG("optind %v", optind);
    opt_cur = optind;
}